

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validatevulnerability.cpp
# Opt level: O0

void __thiscall
ValidateVulnerability::ReadFirstVulnerabilityLine
          (ValidateVulnerability *this,OASIS_FLOAT *totalProbability)

{
  int iVar1;
  char *pcVar2;
  OASIS_FLOAT *totalProbability_local;
  ValidateVulnerability *this_local;
  
  pcVar2 = fgets((this->super_Validate).line_,0x1000,_stdin);
  if (pcVar2 != (char *)0x0) {
    iVar1 = ScanLine(this);
    if (iVar1 == 4) {
      CheckVulnerabilityID(this);
      StoreLine(this);
      this->maxDamageBin_ = (this->v_).damage_bin_id;
      *totalProbability = (this->v_).probability;
      if ((this->allIntensityBinsCheck_ & 1U) == 0) {
        return;
      }
      SetIntensityBinIDs(this);
      return;
    }
    fprintf(_stderr,"ERROR: Invalid data in line %d:\n%s\n",
            (ulong)(uint)(this->super_Validate).lineno_,&this->super_Validate);
    Validate::PrintErrorMessage(&this->super_Validate);
  }
  fprintf(_stderr,"ERROR: Empty file\n");
  Validate::PrintErrorMessage(&this->super_Validate);
  return;
}

Assistant:

void ValidateVulnerability::ReadFirstVulnerabilityLine(OASIS_FLOAT &totalProbability) {

  if (fgets(line_, sizeof(line_), stdin) != 0) {

    if (ScanLine() == 4) {

      CheckVulnerabilityID();
      StoreLine();
      maxDamageBin_ = v_.damage_bin_id;   // Set initial value
      totalProbability = v_.probability;
      if (allIntensityBinsCheck_) SetIntensityBinIDs();

      return;

    }

    fprintf(stderr, "ERROR: Invalid data in line %d:\n%s\n", lineno_, line_);
    PrintErrorMessage();

  }

  fprintf(stderr, "ERROR: Empty file\n");
  PrintErrorMessage();

}